

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::UdpBodySyntax::setChild(UdpBodySyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *pSVar6;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  SyntaxList<slang::syntax::UdpEntrySyntax> *pSVar9;
  UdpInitialStmtSyntax *pUVar10;
  logic_error *this_00;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (4 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar11;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar11[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar12;
    }
    local_d0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x3358);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_b0 == plVar13) {
      local_a0 = *plVar13;
      lStack_98 = plVar11[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar13;
    }
    local_a8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_f0 == plVar13) {
      local_e0 = *plVar13;
      lStack_d8 = plVar11[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar13;
    }
    local_e8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>>
                       (*ppSVar8);
    (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->portDecls).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->portDecls).super_SyntaxListBase.childCount = (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->elements).size_;
    (this->portDecls).elements.data_ = (pSVar6->elements).data_;
    (this->portDecls).elements.size_ = sVar1;
    break;
  case 1:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pUVar10 = (UdpInitialStmtSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pUVar10 = (UdpInitialStmtSyntax *)*ppSVar8;
      if ((pUVar10->super_SyntaxNode).kind != UdpInitialStmt) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::UdpInitialStmtSyntax]");
      }
    }
    this->initialStmt = pUVar10;
    break;
  case 2:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar7->field_0x2;
    NVar4.raw = (pvVar7->numFlags).raw;
    uVar5 = pvVar7->rawLen;
    pIVar2 = pvVar7->info;
    (this->table).kind = pvVar7->kind;
    (this->table).field_0x2 = uVar3;
    (this->table).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->table).rawLen = uVar5;
    (this->table).info = pIVar2;
    break;
  case 3:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar9 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>>(*ppSVar8);
    (this->entries).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->entries).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->entries).super_SyntaxListBase.childCount = (pSVar9->super_SyntaxListBase).childCount;
    sVar1 = (pSVar9->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>).size_;
    (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.data_ =
         (pSVar9->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>).data_;
    (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.size_ =
         sVar1;
    break;
  case 4:
    pvVar7 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar7->field_0x2;
    NVar4.raw = (pvVar7->numFlags).raw;
    uVar5 = pvVar7->rawLen;
    pIVar2 = pvVar7->info;
    (this->endtable).kind = pvVar7->kind;
    (this->endtable).field_0x2 = uVar3;
    (this->endtable).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->endtable).rawLen = uVar5;
    (this->endtable).info = pIVar2;
  }
  return;
}

Assistant:

void UdpBodySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: portDecls = child.node()->as<SeparatedSyntaxList<UdpPortDeclSyntax>>(); return;
        case 1: initialStmt = child.node() ? &child.node()->as<UdpInitialStmtSyntax>() : nullptr; return;
        case 2: table = child.token(); return;
        case 3: entries = child.node()->as<SyntaxList<UdpEntrySyntax>>(); return;
        case 4: endtable = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}